

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexUtils.cpp
# Opt level: O2

void Ptex::v2_2::PtexUtils::encodeDifference(void *data,int size,DataType dt)

{
  char cVar1;
  short sVar2;
  long lVar3;
  char cVar4;
  short sVar5;
  
  if (dt == dt_uint16) {
    sVar5 = 0;
    for (lVar3 = 0; (long)(size / 2) * 2 != lVar3; lVar3 = lVar3 + 2) {
      sVar2 = *(short *)((long)data + lVar3);
      *(short *)((long)data + lVar3) = sVar2 - sVar5;
      sVar5 = sVar2;
    }
  }
  else if (dt == dt_uint8) {
    cVar4 = '\0';
    for (lVar3 = 0; size != lVar3; lVar3 = lVar3 + 1) {
      cVar1 = *(char *)((long)data + lVar3);
      *(char *)((long)data + lVar3) = cVar1 - cVar4;
      cVar4 = cVar1;
    }
  }
  return;
}

Assistant:

void encodeDifference(void* data, int size, DataType dt)
{
    switch (dt) {
    case dt_uint8:    encodeDifference(static_cast<uint8_t*>(data), size); break;
    case dt_uint16:   encodeDifference(static_cast<uint16_t*>(data), size); break;
    default: break; // skip other types
    }
}